

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O3

Matrix3d *
opengv::relative_pose::modules::eigensolver::composeM
          (Matrix3d *__return_storage_ptr__,Matrix3d *xxF,Matrix3d *yyF,Matrix3d *zzF,Matrix3d *xyF,
          Matrix3d *yzF,Matrix3d *zxF,cayley_t *cayley)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  double dVar83;
  undefined1 auVar84 [16];
  double dVar87;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  rotation_t R;
  double local_298;
  double dStack_290;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  double local_228;
  double dStack_220;
  double local_78;
  double dStack_70;
  double local_68;
  double local_60;
  double local_58;
  double dStack_50;
  double local_48;
  double local_40;
  double dStack_38;
  
  math::cayley2rot_reduced(cayley);
  auVar93._8_8_ = local_68;
  auVar93._0_8_ = local_68;
  auVar28 = ZEXT816(0xc000000000000000);
  dVar1 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [0];
  dVar2 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [3];
  dVar3 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [6];
  auVar92._8_8_ = local_60;
  auVar92._0_8_ = local_60;
  auVar88._8_8_ = local_48;
  auVar88._0_8_ = local_48;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dStack_50;
  auVar16 = vmovddup_avx512vl(auVar44);
  dVar4 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [1];
  dVar5 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [2];
  auVar76._8_8_ = 0;
  auVar76._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  dVar6 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [5];
  auVar69._8_8_ = 0;
  auVar69._0_8_ = dVar6;
  auVar84._8_8_ = 0;
  auVar84._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar71._8_8_ = 0;
  auVar71._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dStack_70;
  auVar17 = vmovddup_avx512vl(auVar22);
  auVar44 = *(undefined1 (*) [16])
             ((zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array + 4);
  dVar7 = (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [7];
  dVar8 = (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [8];
  auVar18 = vmulsd_avx512f(auVar92,auVar28);
  auVar19 = vmulsd_avx512f(auVar88,auVar28);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = dVar4;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = dVar2;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = dVar3;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = dVar5;
  dVar9 = (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [1];
  auVar81._8_8_ = 0;
  auVar81._0_8_ = dVar9;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_68 * -2.0;
  auVar20 = vmulsd_avx512f(auVar25,auVar108);
  auVar21 = vmulsd_avx512f(auVar25,auVar115);
  dVar10 = (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[2];
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar10;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = dVar7;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = dVar8;
  auVar110._8_8_ = 0;
  auVar110._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar111._8_8_ = 0;
  auVar111._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar22 = vmulsd_avx512f(auVar18,auVar81);
  auVar23 = vmulsd_avx512f(auVar19,auVar58);
  auVar24 = vaddsd_avx512f(auVar22,auVar23);
  auVar23 = vmulsd_avx512f(auVar18,auVar110);
  auVar25 = vmulsd_avx512f(auVar19,auVar111);
  auVar22 = *(undefined1 (*) [16])
             ((zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array + 7);
  auVar65._8_8_ = dStack_70;
  auVar65._0_8_ = local_78;
  auVar23 = vaddsd_avx512f(auVar23,auVar25);
  auVar26 = vmulsd_avx512f(auVar19,auVar107);
  auVar66._8_8_ = dStack_50;
  auVar66._0_8_ = local_58;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = local_68 * dVar1;
  auVar25 = vunpcklpd_avx(auVar34,auVar23);
  auVar23 = vmulsd_avx512f(auVar18,auVar104);
  auVar27 = vaddsd_avx512f(auVar23,auVar26);
  auVar95._8_8_ = dStack_38;
  auVar95._0_8_ = dStack_38;
  auVar23 = vmulsd_avx512f(auVar16,auVar28);
  auVar26 = vmulsd_avx512f(auVar23,auVar101);
  auVar28 = vmulsd_avx512f(auVar95,auVar28);
  auVar29 = vmulsd_avx512f(auVar28,auVar118);
  auVar26 = vaddsd_avx512f(auVar26,auVar29);
  auVar29 = vmulsd_avx512f(auVar28,auVar69);
  auVar30 = vmulsd_avx512f(auVar23,auVar76);
  auVar29 = vaddsd_avx512f(auVar30,auVar29);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = local_68 * -2.0 * dVar1 + auVar26._0_8_;
  auVar31 = vmulsd_avx512f(auVar38,auVar17);
  auVar20 = vaddsd_avx512f(auVar20,auVar29);
  auVar23 = vmulsd_avx512f(auVar23,auVar84);
  auVar26 = vmulsd_avx512f(auVar28,auVar71);
  auVar15._8_8_ = dStack_38;
  auVar15._0_8_ = local_40;
  dVar11 = (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[6];
  auVar23 = vaddsd_avx512f(auVar23,auVar26);
  auVar26 = vmulsd_avx512f(auVar20,auVar66);
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar20 = vmulsd_avx512f(auVar15,auVar20);
  dVar13 = (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[1];
  dVar14 = (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[2];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = local_40 * (auVar21._0_8_ + auVar23._0_8_);
  auVar32 = vaddsd_avx512f(auVar26,auVar32);
  auVar21 = vshufpd_avx512vl(auVar65,auVar65,1);
  dVar12 = (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[6];
  auVar23._8_8_ = dVar12;
  auVar23._0_8_ = dVar12;
  auVar30 = vmulpd_avx512vl(auVar21,auVar23);
  dVar12 = (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[3];
  auVar26._8_8_ = dVar12;
  auVar26._0_8_ = dVar12;
  auVar33 = vmulpd_avx512vl(auVar21,auVar26);
  dVar12 = (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[0];
  auVar28._8_8_ = dVar12;
  auVar28._0_8_ = dVar12;
  auVar34 = vmulpd_avx512vl(auVar21,auVar28);
  auVar23 = vmulsd_avx512f(auVar95,auVar71);
  auVar35._8_8_ = local_48;
  auVar35._0_8_ = local_58;
  auVar26 = vmulpd_avx512vl(auVar22,auVar35);
  auVar35 = vmulpd_avx512vl(auVar44,auVar35);
  auVar70._0_8_ = dVar13 * local_58;
  auVar70._8_8_ = dVar14 * local_48;
  auVar20 = vaddsd_avx512f(auVar35,auVar20);
  auVar20 = vaddsd_avx512f(auVar33,auVar20);
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       local_40 *
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar21 = vaddsd_avx512f(auVar26,auVar39);
  auVar20 = vmulsd_avx512f(auVar66,auVar20);
  auVar21 = vaddsd_avx512f(auVar30,auVar21);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = local_40 * auVar21._0_8_;
  auVar36 = vaddsd_avx512f(auVar20,auVar40);
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       auVar34._0_8_ +
       auVar70._0_8_ +
       local_40 *
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar37 = vmulsd_avx512f(auVar17,auVar37);
  auVar20 = vunpckhpd_avx512vl(auVar65,auVar93);
  auVar38 = vmulsd_avx512f(auVar16,auVar76);
  auVar82._8_8_ = 0;
  auVar82._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar2;
  auVar39 = vmulsd_avx512f(auVar93,auVar41);
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar28 = vmovddup_avx512vl(auVar21);
  auVar21 = vmulsd_avx512f(auVar16,auVar84);
  auVar21 = vaddsd_avx512f(auVar21,auVar23);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar3;
  auVar23 = vmulsd_avx512f(auVar93,auVar42);
  auVar40 = vaddsd_avx512f(auVar23,auVar21);
  auVar97._8_8_ = 0;
  auVar97._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar21 = vunpcklpd_avx512vl(auVar82,auVar97);
  auVar41 = vmulpd_avx512vl(auVar20,auVar21);
  auVar99._8_8_ = 0;
  auVar99._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar21 = vunpcklpd_avx512vl(auVar28,auVar99);
  auVar42 = vmulpd_avx512vl(auVar20,auVar21);
  auVar102._8_8_ = 0;
  auVar102._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar11;
  auVar21 = vunpcklpd_avx512vl(auVar49,auVar102);
  dVar83 = auVar21._0_8_ * auVar20._0_8_;
  dVar87 = auVar21._8_8_ * auVar20._8_8_;
  auVar29._8_8_ = 0x8000000000000000;
  auVar29._0_8_ = 0x8000000000000000;
  auVar43 = vxorpd_avx512vl(auVar15,auVar29);
  auVar23 = vunpcklpd_avx(auVar92,auVar43);
  auVar45._0_8_ = dVar13 * auVar23._0_8_;
  auVar45._8_8_ = dVar14 * auVar23._8_8_;
  auVar20 = vshufpd_avx(auVar45,auVar45,1);
  auVar21 = vsubpd_avx(auVar20,auVar70);
  auVar21 = vsubpd_avx(auVar21,auVar34);
  auVar44 = vmulpd_avx512vl(auVar44,auVar23);
  auVar23 = vmulpd_avx512vl(auVar22,auVar23);
  auVar22 = vshufpd_avx(auVar44,auVar44,1);
  auVar44 = vshufpd_avx(auVar23,auVar23,1);
  auVar23 = vsubpd_avx(auVar22,auVar35);
  auVar23 = vsubpd_avx(auVar23,auVar33);
  auVar29 = vsubpd_avx512vl(auVar44,auVar26);
  auVar44 = vaddpd_avx512vl(auVar44,auVar26);
  auVar45 = vsubpd_avx512vl(auVar29,auVar30);
  auVar46 = vaddpd_avx512vl(auVar44,auVar30);
  auVar26 = vshufpd_avx512vl(auVar66,auVar65,1);
  auVar47._8_8_ = 0xc000000000000000;
  auVar47._0_8_ = 0xc000000000000000;
  auVar44 = vmovlpd_avx(auVar47,dVar4);
  auVar72._0_8_ = auVar26._0_8_ * auVar44._0_8_;
  auVar72._8_8_ = auVar26._8_8_ * auVar44._8_8_;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar5;
  auVar47 = vmulsd_avx512f(auVar95,auVar48);
  auVar48 = vmulpd_avx512vl(auVar72,auVar28);
  auVar29 = vshufpd_avx512vl(auVar72,auVar72,1);
  auVar49 = vmulsd_avx512f(auVar29,auVar49);
  local_228 = auVar25._0_8_;
  dStack_220 = auVar25._8_8_;
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar44 = vunpcklpd_avx512vl(auVar110,auVar50);
  auVar25 = vmulsd_avx512f(auVar66,auVar50);
  auVar50 = vmulpd_avx512vl(auVar66,auVar44);
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar44 = vunpcklpd_avx(auVar104,auVar51);
  auVar30 = vmulsd_avx512f(auVar66,auVar51);
  auVar51 = vmulpd_avx512vl(auVar66,auVar44);
  dVar2 = (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [5];
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar2;
  auVar52 = vunpcklpd_avx512vl(auVar111,auVar52);
  auVar44 = vmulsd_avx512f(auVar17,auVar99);
  dVar3 = (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [8];
  auVar62._8_8_ = 0;
  auVar62._0_8_ = dVar3;
  auVar55._0_8_ = auVar42._0_8_ + auVar50._0_8_ + local_40 * auVar52._0_8_;
  auVar55._8_8_ = auVar42._8_8_ + auVar50._8_8_ + dStack_38 * auVar52._8_8_;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = auVar44._0_8_ + auVar25._0_8_ + local_40 * dVar2;
  auVar44 = vmulsd_avx512f(auVar66,auVar53);
  auVar53 = vmulpd_avx512vl(auVar16,auVar55);
  auVar26 = vunpcklpd_avx(auVar107,auVar62);
  auVar54 = vmulsd_avx512f(auVar17,auVar102);
  dVar2 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [4];
  auVar55 = vmulsd_avx512f(auVar65,auVar82);
  auVar25 = vmulsd_avx512f(auVar88,auVar111);
  dVar4 = (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [2];
  auVar56 = vmulsd_avx512f(auVar92,auVar110);
  dVar5 = (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [6];
  auVar28 = vmulsd_avx512f(auVar65,auVar28);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = dVar4;
  auVar57 = vmulsd_avx512f(auVar19,auVar113);
  local_238._8_8_ = 0;
  local_238._0_8_ = auVar28._0_8_ + auVar56._0_8_ + auVar25._0_8_;
  dVar12 = (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[0];
  auVar96._8_8_ = 0;
  auVar96._0_8_ = dVar12;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = dVar11;
  auVar25 = vmulsd_avx512f(auVar65,auVar105);
  dVar11 = (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[3];
  local_248._8_8_ = 0;
  local_248._0_8_ = auVar25._0_8_ + local_60 * dVar7 + local_48 * dVar8;
  auVar59._8_8_ = 0;
  auVar59._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar25 = vunpcklpd_avx(auVar81,auVar59);
  auVar56 = vmulsd_avx512f(auVar66,auVar59);
  dVar7 = (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [2];
  auVar77._8_8_ = 0;
  auVar77._0_8_ = dVar7;
  auVar28 = vunpcklpd_avx(auVar58,auVar77);
  auVar85._8_8_ = 0;
  auVar85._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar58 = vmulsd_avx512f(auVar17,auVar97);
  auVar98._8_8_ = 0;
  auVar98._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = auVar58._0_8_ + auVar56._0_8_ + local_40 * dVar7;
  auVar56 = vmulsd_avx512f(auVar17,auVar60);
  auVar58 = vmulsd_avx512f(auVar19,auVar98);
  auVar100._8_8_ = 0;
  auVar100._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar59 = vmulsd_avx512f(auVar18,auVar100);
  auVar60 = vmulsd_avx512f(auVar29,auVar96);
  auVar109._8_8_ = 0;
  auVar109._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar61 = vmulsd_avx512f(auVar18,auVar109);
  auVar73._8_8_ = 0;
  auVar73._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = dVar11;
  auVar62 = vmulsd_avx512f(auVar29,auVar106);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = auVar60._0_8_ + auVar59._0_8_ + auVar57._0_8_;
  auVar57 = vmulsd_avx512f(auVar17,auVar63);
  dVar7 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [7];
  auVar67._8_8_ = 0;
  auVar67._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar19 = vmulsd_avx512f(auVar19,auVar73);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = auVar62._0_8_ + auVar61._0_8_ + auVar58._0_8_;
  auVar58 = vmulsd_avx512f(auVar66,auVar64);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = dVar7;
  auVar59 = vmulsd_avx512f(auVar117,auVar92);
  auVar18 = vmulsd_avx512f(auVar18,auVar67);
  auVar68._8_8_ = 0;
  auVar68._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = dVar5;
  auVar29 = vmulsd_avx512f(auVar29,auVar112);
  dVar8 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [1];
  auVar60 = vmulsd_avx512f(auVar68,auVar88);
  auVar59 = vaddsd_avx512f(auVar59,auVar60);
  dVar13 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[2];
  auVar74._8_8_ = 0;
  auVar74._0_8_ = dVar13;
  auVar119._8_8_ = 0;
  auVar119._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar60 = vmulsd_avx512f(auVar119,auVar65);
  auVar59 = vaddsd_avx512f(auVar60,auVar59);
  auVar60 = vunpcklpd_avx512vl(auVar93,auVar115);
  auVar59 = vmulsd_avx512f(auVar88,auVar59);
  auVar61 = vmulsd_avx512f(auVar85,auVar65);
  auVar62 = vunpcklpd_avx512vl(auVar85,auVar65);
  dVar14 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[5];
  auVar75._8_8_ = 0;
  auVar75._0_8_ = dVar14;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = dVar2;
  auVar63 = vmulsd_avx512f(auVar103,auVar92);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = auVar61._0_8_ + local_60 * dVar8 + local_48 * dVar13;
  auVar61 = vmulsd_avx512f(auVar65,auVar89);
  auVar64 = vmulsd_avx512f(auVar75,auVar88);
  auVar63 = vaddsd_avx512f(auVar63,auVar64);
  auVar116._8_8_ = 0;
  auVar116._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar64 = vmulsd_avx512f(auVar116,auVar65);
  auVar63 = vaddsd_avx512f(auVar64,auVar63);
  auVar63 = vmulsd_avx512f(auVar92,auVar63);
  auVar59 = vaddsd_avx512f(auVar63,auVar59);
  auVar63 = vunpcklpd_avx512vl(auVar93,auVar108);
  auVar59 = vaddsd_avx512f(auVar61,auVar59);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[8] =
       auVar59._0_8_ +
       auVar57._0_8_ + auVar58._0_8_ + local_40 * (auVar29._0_8_ + auVar18._0_8_ + auVar19._0_8_) +
       auVar56._0_8_ + auVar44._0_8_ + local_40 * (auVar54._0_8_ + auVar30._0_8_ + local_40 * dVar3)
  ;
  auVar78._8_8_ = local_60;
  auVar78._0_8_ = dVar8;
  auVar44 = vunpcklpd_avx512vl(auVar16,auVar101);
  auVar29 = vmulpd_avx512vl(auVar44,auVar78);
  auVar54._8_8_ = local_60;
  auVar54._0_8_ = dVar2;
  auVar44 = vunpcklpd_avx512vl(auVar16,auVar76);
  auVar18 = vmulpd_avx512vl(auVar44,auVar54);
  auVar44 = vunpcklpd_avx512vl(auVar16,auVar84);
  auVar79._0_8_ = auVar44._0_8_ * dVar7;
  auVar79._8_8_ = auVar44._8_8_ * local_60;
  auVar19 = vunpcklpd_avx512vl(auVar16,auVar82);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = dStack_38 * dVar14;
  auVar44 = vaddsd_avx512f(auVar18,auVar80);
  auVar30 = vunpcklpd_avx512vl(auVar116,auVar65);
  auVar54 = vmulpd_avx512vl(auVar63,auVar30);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = auVar44._0_8_ + auVar54._0_8_;
  auVar16 = vmulsd_avx512f(auVar16,auVar90);
  auVar56 = vmulsd_avx512f(auVar95,auVar68);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar1;
  auVar44 = vunpcklpd_avx(auVar93,auVar30);
  auVar30 = vaddsd_avx512f(auVar79,auVar56);
  auVar65 = vunpcklpd_avx512vl(auVar119,auVar65);
  auVar65 = vmulpd_avx512vl(auVar60,auVar65);
  auVar30 = vaddsd_avx512f(auVar65,auVar30);
  auVar30 = vmulsd_avx512f(auVar95,auVar30);
  auVar16 = vaddsd_avx512f(auVar16,auVar30);
  auVar30 = vmulsd_avx512f(auVar95,auVar74);
  auVar30 = vaddsd_avx512f(auVar29,auVar30);
  auVar56 = vmulpd_avx512vl(auVar44,auVar62);
  auVar61._0_8_ = dVar12 * auVar44._0_8_;
  auVar61._8_8_ = dStack_70 * auVar44._8_8_;
  auVar57 = vunpcklpd_avx512vl(auVar76,auVar109);
  auVar44 = vaddsd_avx512f(auVar56,auVar30);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[0] =
       local_68 * auVar44._0_8_ + auVar16._0_8_ + auVar31._0_8_ + auVar32._0_8_ +
       auVar36._0_8_ + auVar37._0_8_;
  auVar44 = vunpckhpd_avx(auVar15,auVar88);
  auVar16._8_8_ = 0x8000000000000000;
  auVar16._0_8_ = 0x8000000000000000;
  auVar16 = vxorpd_avx512vl(auVar44,auVar16);
  auVar44 = vunpcklpd_avx512vl(auVar101,auVar100);
  auVar30 = vmulpd_avx512vl(auVar66,auVar57);
  auVar44 = vmulpd_avx512vl(auVar66,auVar44);
  auVar31 = vshufpd_avx512vl(auVar30,auVar30,1);
  auVar32 = vshufpd_avx512vl(auVar44,auVar44,1);
  auVar36 = vmulsd_avx512f(auVar98,auVar16);
  auVar37 = vmulsd_avx512f(auVar113,auVar16);
  auVar31 = vsubsd_avx512f(auVar36,auVar31);
  auVar36._8_8_ = dStack_70;
  auVar36._0_8_ = dVar11;
  auVar57._8_8_ = dStack_70;
  auVar57._0_8_ = dVar5;
  auVar32 = vsubsd_avx512f(auVar37,auVar32);
  auVar36 = vmulpd_avx512vl(auVar63,auVar36);
  auVar37 = vunpcklpd_avx512vl(auVar84,auVar67);
  auVar58 = vmulpd_avx512vl(auVar66,auVar25);
  auVar57 = vmulpd_avx512vl(auVar60,auVar57);
  auVar66 = vmulpd_avx512vl(auVar66,auVar37);
  auVar25 = vmulsd_avx512f(auVar73,auVar16);
  auVar37 = vunpcklpd_avx512vl(auVar74,auVar118);
  auVar37 = vmulpd_avx512vl(auVar37,auVar16);
  auVar59 = vshufpd_avx512vl(auVar66,auVar66,1);
  auVar25 = vsubsd_avx512f(auVar25,auVar59);
  auVar29 = vsubpd_avx512vl(auVar37,auVar29);
  auVar25 = vsubsd_avx512f(auVar25,auVar57);
  auVar37 = vsubpd_avx512vl(auVar29,auVar56);
  auVar25 = vmulsd_avx512f(auVar95,auVar25);
  auVar114._8_8_ = 0;
  auVar114._0_8_ = dVar4;
  auVar56 = vunpcklpd_avx512vl(auVar118,auVar114);
  auVar29 = vunpcklpd_avx(auVar25,auVar24);
  auVar25 = vmulpd_avx512vl(auVar15,auVar56);
  auVar24 = vunpcklpd_avx512vl(auVar75,auVar69);
  auVar24 = vmulpd_avx512vl(auVar24,auVar16);
  auVar25 = vaddpd_avx512vl(auVar44,auVar25);
  auVar32 = vsubsd_avx512f(auVar32,auVar61);
  auVar44 = vshufpd_avx(auVar61,auVar61,1);
  auVar56 = vshufpd_avx512vl(auVar36,auVar36,1);
  auVar18 = vsubpd_avx512vl(auVar24,auVar18);
  auVar86._0_8_ = auVar25._0_8_ + auVar44._0_8_;
  auVar86._8_8_ = auVar25._8_8_ + auVar44._8_8_;
  auVar44 = vunpcklpd_avx512vl(auVar69,auVar98);
  auVar24 = vsubsd_avx512f(auVar31,auVar36);
  auVar25 = vsubpd_avx(auVar18,auVar54);
  auVar91._0_8_ = auVar56._0_8_ + auVar30._0_8_ + local_40 * auVar44._0_8_;
  auVar91._8_8_ = auVar56._8_8_ + auVar30._8_8_ + dStack_38 * auVar44._8_8_;
  auVar44 = vunpcklpd_avx512vl(auVar71,auVar73);
  auVar18 = vshufpd_avx512vl(auVar57,auVar57,1);
  auVar31._0_8_ = local_40 * auVar44._0_8_;
  auVar31._8_8_ = dStack_38 * auVar44._8_8_;
  auVar44 = vaddpd_avx512vl(auVar66,auVar31);
  auVar56._0_8_ = auVar18._0_8_ + auVar44._0_8_;
  auVar56._8_8_ = auVar18._8_8_ + auVar44._8_8_;
  local_298 = auVar19._0_8_;
  dStack_290 = auVar19._8_8_;
  auVar44 = vmulpd_avx512vl(auVar15,auVar28);
  auVar18 = vunpcklpd_avx512vl(auVar68,auVar71);
  auVar94._0_8_ = auVar58._0_8_ + auVar44._0_8_;
  auVar94._8_8_ = auVar58._8_8_ + auVar44._8_8_;
  auVar44 = vmulpd_avx512vl(auVar18,auVar16);
  auVar18 = vmulsd_avx512f(auVar93,auVar32);
  auVar19 = vaddpd_avx512vl(auVar41,auVar94);
  auVar44 = vsubpd_avx(auVar44,auVar79);
  auVar30 = vsubpd_avx512vl(auVar44,auVar65);
  auVar44 = vshufpd_avx(auVar56,local_248,1);
  auVar24._0_8_ =
       local_68 * auVar19._0_8_ +
       auVar53._0_8_ + dStack_38 * (dVar83 + auVar51._0_8_ + local_40 * auVar26._0_8_) +
       auVar18._0_8_ + auVar29._0_8_ + auVar24._0_8_ * local_298 +
       (auVar72._0_8_ + auVar47._0_8_ + local_228) * local_78 +
       auVar40._0_8_ * local_48 + local_60 * (auVar39._0_8_ + dStack_38 * dVar6 + auVar38._0_8_) +
       auVar21._0_8_ * local_78 + local_60 * auVar23._0_8_ + local_48 * auVar45._0_8_;
  auVar24._8_8_ =
       local_68 * auVar19._8_8_ +
       auVar53._8_8_ + dStack_38 * (dVar87 + auVar51._8_8_ + dStack_38 * auVar26._8_8_) +
       local_68 * (auVar29._8_8_ + auVar72._8_8_ * dStack_290) +
       (auVar48._8_8_ + dStack_220) * dStack_50 + dStack_38 * (auVar49._0_8_ + auVar27._0_8_) +
       (auVar20._8_8_ + auVar70._8_8_ + auVar34._8_8_) * local_78 +
       local_60 * (auVar22._8_8_ + auVar35._8_8_ + auVar33._8_8_) + local_48 * auVar46._8_8_;
  auVar22 = vshufpd_avx(auVar91,local_238,1);
  auVar20 = vunpcklpd_avx512vl(auVar43,auVar16);
  auVar33._0_8_ = auVar20._0_8_ * auVar52._0_8_;
  auVar33._8_8_ = auVar20._8_8_ * auVar52._8_8_;
  *(undefined1 (*) [16])
   ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
    .m_data.array + 3) = auVar24;
  auVar23 = vmulpd_avx512vl(auVar28,auVar20);
  auVar27._0_8_ = auVar20._0_8_ * auVar26._0_8_;
  auVar27._8_8_ = auVar20._8_8_ * auVar26._8_8_;
  auVar20 = vsubpd_avx(auVar33,auVar50);
  auVar21 = vsubpd_avx(auVar27,auVar51);
  auVar23 = vsubpd_avx(auVar23,auVar58);
  auVar26 = vsubpd_avx(auVar20,auVar42);
  auVar19._8_8_ = dVar87;
  auVar19._0_8_ = dVar83;
  auVar21 = vsubpd_avx(auVar21,auVar19);
  auVar23 = vsubpd_avx512vl(auVar23,auVar41);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = auVar55._0_8_ + local_60 * dVar9 + local_48 * dVar10;
  auVar20 = vshufpd_avx(auVar86,auVar18,1);
  auVar23 = vmulpd_avx512vl(auVar17,auVar23);
  auVar20 = vmulpd_avx512vl(auVar17,auVar20);
  auVar17._0_8_ =
       auVar86._0_8_ * local_78 + local_60 * auVar91._0_8_ + local_48 * auVar56._0_8_ +
       auVar20._0_8_ + local_58 * auVar22._0_8_ + local_40 * auVar44._0_8_ +
       local_78 * auVar37._0_8_ + local_60 * auVar25._0_8_ + local_48 * auVar30._0_8_ +
       auVar23._0_8_ + local_58 * auVar26._0_8_ + local_40 * auVar21._0_8_;
  auVar17._8_8_ =
       auVar86._8_8_ * local_78 + local_60 * auVar91._8_8_ + local_48 * auVar56._8_8_ +
       auVar20._8_8_ + local_58 * auVar22._8_8_ + local_40 * auVar44._8_8_ +
       local_78 * auVar37._8_8_ + local_60 * auVar25._8_8_ + local_48 * auVar30._8_8_ +
       auVar23._8_8_ + local_58 * auVar26._8_8_ + local_40 * auVar21._8_8_;
  dVar1 = (double)vmovhpd_avx(auVar17);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[7] = dVar1;
  auVar22 = vunpcklpd_avx(auVar24,auVar17);
  auVar44 = vshufpd_avx(auVar17,auVar17,1);
  *(undefined1 (*) [16])
   ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
    .m_data.array + 1) = auVar22;
  *(undefined1 (*) [16])
   ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
    .m_data.array + 5) = auVar44;
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix3d
opengv::relative_pose::modules::eigensolver::composeM(
  const Eigen::Matrix3d & xxF,
  const Eigen::Matrix3d & yyF,
  const Eigen::Matrix3d & zzF,
  const Eigen::Matrix3d & xyF,
  const Eigen::Matrix3d & yzF,
  const Eigen::Matrix3d & zxF,
  const cayley_t & cayley)
{
  Eigen::Matrix3d M;
  rotation_t R = math::cayley2rot_reduced(cayley);

  //Fill the matrix M using the precomputed summation terms
  double temp;
  temp =      R.row(2)*yyF*R.row(2).transpose();
  M(0,0)  = temp;
  temp = -2.0*R.row(2)*yzF*R.row(1).transpose();
  M(0,0) += temp;
  temp =      R.row(1)*zzF*R.row(1).transpose();
  M(0,0) += temp;

  temp =      R.row(2)*yzF*R.row(0).transpose();
  M(0,1)  = temp;
  temp = -1.0*R.row(2)*xyF*R.row(2).transpose();
  M(0,1) += temp;
  temp = -1.0*R.row(1)*zzF*R.row(0).transpose();
  M(0,1) += temp;
  temp =      R.row(1)*zxF*R.row(2).transpose();
  M(0,1) += temp;

  temp =      R.row(2)*xyF*R.row(1).transpose();
  M(0,2)  = temp;
  temp = -1.0*R.row(2)*yyF*R.row(0).transpose();
  M(0,2) += temp;
  temp = -1.0*R.row(1)*zxF*R.row(1).transpose();
  M(0,2) += temp;
  temp =      R.row(1)*yzF*R.row(0).transpose();
  M(0,2) += temp;

  temp =      R.row(0)*zzF*R.row(0).transpose();
  M(1,1)  = temp;
  temp = -2.0*R.row(0)*zxF*R.row(2).transpose();
  M(1,1) += temp;
  temp =      R.row(2)*xxF*R.row(2).transpose();
  M(1,1) += temp;

  temp =      R.row(0)*zxF*R.row(1).transpose();
  M(1,2)  = temp;
  temp = -1.0*R.row(0)*yzF*R.row(0).transpose();
  M(1,2) += temp;
  temp = -1.0*R.row(2)*xxF*R.row(1).transpose();
  M(1,2) += temp;
  temp =      R.row(2)*xyF*R.row(0).transpose();
  M(1,2) += temp;

  temp =      R.row(1)*xxF*R.row(1).transpose();
  M(2,2)  = temp;
  temp = -2.0*R.row(0)*xyF*R.row(1).transpose();
  M(2,2) += temp;
  temp =      R.row(0)*yyF*R.row(0).transpose();
  M(2,2) += temp;

  M(1,0) = M(0,1);
  M(2,0) = M(0,2);
  M(2,1) = M(1,2);

  return M;
}